

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

GLuint deqp::gls::LifetimeTests::details::getAttachment(Attacher *attacher,GLuint container)

{
  int iVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double __x;
  char *local_1b8;
  char *local_1b0 [3];
  MessageBuilder local_198;
  GLuint local_18;
  GLuint local_14;
  GLuint queriedAttachment;
  GLuint container_local;
  Attacher *attacher_local;
  
  local_14 = container;
  _queriedAttachment = attacher;
  local_18 = (*attacher->_vptr_Attacher[3])(attacher,(ulong)container);
  ContextWrapper::log(&_queriedAttachment->super_ContextWrapper,__x);
  tcu::TestLog::operator<<(&local_198,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [24])"// Result of query for ");
  pTVar3 = Attacher::getElementType(_queriedAttachment);
  iVar1 = (*pTVar3->_vptr_Type[7])();
  local_1b0[0] = (char *)CONCAT44(extraout_var,iVar1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])" attached to ");
  pTVar3 = Attacher::getContainerType(_queriedAttachment);
  iVar1 = (*pTVar3->_vptr_Type[7])();
  local_1b8 = (char *)CONCAT44(extraout_var_00,iVar1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1b8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c6cdd6);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_14);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a0a8b4);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_18);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b5e49a);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return local_18;
}

Assistant:

GLuint getAttachment (Attacher& attacher, GLuint container)
{
	const GLuint queriedAttachment = attacher.getAttachment(container);
	attacher.log() << TestLog::Message
				   << "// Result of query for " << attacher.getElementType().getName()
				   << " attached to " << attacher.getContainerType().getName() << " "
				   << container << ": " << queriedAttachment << "."
				   << TestLog::EndMessage;
	return queriedAttachment;
}